

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ProgramStateCase::verify
          (ProgramStateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  int extraout_EAX;
  MessageBuilder *pMVar3;
  undefined7 extraout_var;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  ProgramInfo *local_30;
  ProgramInfo *programInfo;
  TestLog *log;
  ProgramInfo *reference_local;
  Program *program_local;
  ProgramStateCase *this_local;
  int iVar2;
  
  log = (TestLog *)sig;
  reference_local = (ProgramInfo *)ctx;
  program_local = (Program *)this;
  programInfo = (ProgramInfo *)
                tcu::TestContext::getLog
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
  local_30 = glu::Program::getInfo((Program *)reference_local);
  if ((local_30->linkOk & 1U) == 0) {
    tcu::TestLog::operator<<
              (&local_1b0,(TestLog *)programInfo,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [86])
                        "Fail, link status may only change as a result of linking or loading a program binary."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Link status changed");
  }
  if ((qpTestLog *)local_30->linkTimeUs != log[5].m_log) {
    tcu::TestLog::operator<<
              (&local_340,(TestLog *)programInfo,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_340,(char (*) [34])"Fail, reported link time changed.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Link time changed");
  }
  bVar1 = std::operator!=(&local_30->infoLog,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)log);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    tcu::TestLog::operator<<
              (&local_4c0,(TestLog *)programInfo,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_4c0,(char (*) [31])"Fail, program infolog changed.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Infolog changed");
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void ProgramStateCase::verify (glu::Program& program, const glu::ProgramInfo& reference)
{
	TestLog&				log			= m_testCtx.getLog();
	const glu::ProgramInfo&	programInfo	= program.getInfo();

	if (!programInfo.linkOk)
	{
		log << TestLog::Message << "Fail, link status may only change as a result of linking or loading a program binary." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Link status changed");
	}

	if (programInfo.linkTimeUs != reference.linkTimeUs)
	{
		log << TestLog::Message << "Fail, reported link time changed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Link time changed");
	}

	if (programInfo.infoLog != reference.infoLog)
	{
		log << TestLog::Message << "Fail, program infolog changed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Infolog changed");
	}
}